

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_ParseOutputDescriptor_Test::TestBody(AddressFactory_ParseOutputDescriptor_Test *this)

{
  initializer_list<TestCfdAddressFactoryDescriptorData> __l;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  exception *e;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AddressFactory factory;
  TestCfdAddressFactoryDescriptorData test_data;
  iterator __end1;
  iterator __begin1;
  vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
  *__range1;
  DescriptorScriptData data;
  vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
  g_test_cfd_descriptor_data;
  DescriptorScriptData *in_stack_ffffffffffffdea8;
  DescriptorScriptData *in_stack_ffffffffffffdeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdeb8;
  vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
  *in_stack_ffffffffffffdec0;
  char *in_stack_ffffffffffffdec8;
  allocator_type *in_stack_ffffffffffffded8;
  undefined7 in_stack_ffffffffffffdee0;
  undefined1 in_stack_ffffffffffffdee7;
  TestCfdAddressFactoryDescriptorData *in_stack_ffffffffffffdee8;
  undefined6 in_stack_ffffffffffffdef0;
  undefined1 in_stack_ffffffffffffdef6;
  byte in_stack_ffffffffffffdef7;
  string *local_2018;
  AssertHelper local_1948;
  Message local_1940;
  string local_1938 [32];
  AssertionResult local_1918;
  string local_1908;
  AssertHelper local_18e8;
  Message local_18e0;
  byte local_18d1;
  AssertionResult local_18d0;
  AssertHelper local_18c0;
  Message local_18b8;
  AssertionResult local_18b0;
  AssertHelper local_18a0;
  Message local_1898;
  AssertionResult local_1890;
  AssertHelper local_1880;
  Message local_1878;
  AssertionResult local_1870;
  AssertHelper local_1860;
  Message local_1858;
  string local_1850 [32];
  AssertionResult local_1830;
  AssertHelper local_1820;
  Message local_1818;
  AssertionResult local_1810;
  AssertHelper local_1800;
  Message local_17f8;
  string local_17f0 [32];
  AssertionResult local_17d0;
  AssertHelper local_17c0;
  Message local_17b8;
  AssertionResult local_17b0;
  AssertHelper local_17a0;
  Message local_1798;
  string local_1790 [32];
  AssertionResult local_1770;
  AssertHelper local_1760;
  Message local_1758;
  AssertionResult local_1750;
  allocator local_1739;
  string local_1738 [32];
  string local_1718 [824];
  AddressFactory local_13e0;
  vector local_13b8 [32];
  NetType local_1398;
  undefined1 local_12f8 [48];
  __normal_iterator<TestCfdAddressFactoryDescriptorData_*,_std::vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>_>
  local_12c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_12c0 [52];
  undefined1 local_f7c;
  undefined1 local_f7b;
  undefined1 local_f7a;
  undefined1 local_f79;
  undefined1 local_f78;
  undefined1 local_f77;
  allocator local_f76;
  allocator local_f75;
  allocator local_f74;
  allocator local_f73;
  allocator local_f72;
  allocator local_f71;
  undefined1 local_f70;
  undefined1 local_f6f;
  undefined1 local_f6e;
  undefined1 local_f6d;
  undefined1 local_f6c;
  allocator local_f6b;
  allocator local_f6a;
  allocator local_f69;
  allocator local_f68;
  allocator local_f67;
  allocator local_f66;
  undefined1 local_f65;
  undefined1 local_f64;
  undefined1 local_f63;
  undefined1 local_f62;
  undefined1 local_f61;
  allocator local_f60;
  allocator local_f5f;
  allocator local_f5e;
  allocator local_f5d;
  allocator local_f5c;
  allocator local_f5b;
  undefined1 local_f5a;
  undefined1 local_f59;
  undefined1 local_f58;
  undefined1 local_f57;
  undefined1 local_f56;
  allocator local_f55;
  allocator local_f54;
  allocator local_f53;
  allocator local_f52;
  allocator local_f51;
  allocator local_f50;
  undefined1 local_f4f;
  undefined1 local_f4e;
  undefined1 local_f4d;
  undefined1 local_f4c;
  undefined1 local_f4b;
  allocator local_f4a;
  allocator local_f49;
  allocator local_f48;
  allocator local_f47;
  allocator local_f46;
  allocator local_f45;
  undefined1 local_f44;
  undefined1 local_f43;
  undefined1 local_f42;
  undefined1 local_f41;
  undefined1 local_f40;
  allocator local_f3f;
  allocator local_f3e;
  allocator local_f3d;
  allocator local_f3c;
  allocator local_f3b;
  allocator local_f3a;
  undefined1 local_f39;
  undefined1 local_f38;
  undefined1 local_f37;
  undefined1 local_f36;
  undefined1 local_f35;
  allocator local_f34;
  allocator local_f33;
  allocator local_f32;
  allocator local_f31;
  allocator local_f30;
  allocator local_f2f;
  undefined1 local_f2e;
  undefined1 local_f2d;
  undefined1 local_f2c;
  undefined1 local_f2b;
  undefined1 local_f2a;
  allocator local_f29;
  allocator local_f28;
  allocator local_f27;
  allocator local_f26;
  allocator local_f25;
  allocator local_f24;
  undefined1 local_f23;
  undefined1 local_f22;
  undefined1 local_f21;
  undefined1 local_f20;
  undefined1 local_f1f;
  allocator local_f1e;
  allocator local_f1d;
  allocator local_f1c;
  allocator local_f1b;
  allocator local_f1a;
  allocator local_f19;
  undefined1 local_f18;
  undefined1 local_f17;
  undefined1 local_f16;
  undefined1 local_f15;
  undefined1 local_f14;
  allocator local_f13;
  allocator local_f12;
  allocator local_f11;
  allocator local_f10;
  allocator local_f0f;
  allocator local_f0e;
  undefined1 local_f0d;
  undefined1 local_f0c;
  undefined1 local_f0b;
  undefined1 local_f0a;
  undefined1 local_f09;
  allocator local_f08;
  allocator local_f07;
  allocator local_f06;
  allocator local_f05;
  allocator local_f04;
  allocator local_f03;
  undefined1 local_f02;
  undefined1 local_f01;
  undefined1 local_f00;
  undefined1 local_eff;
  undefined1 local_efe;
  allocator local_efd;
  allocator local_efc;
  allocator local_efb;
  allocator local_efa;
  allocator local_ef9;
  allocator local_ef8;
  undefined1 local_ef7;
  undefined1 local_ef6;
  undefined1 local_ef5;
  undefined1 local_ef4;
  undefined1 local_ef3;
  allocator local_ef2;
  allocator local_ef1;
  allocator local_ef0;
  allocator local_eef;
  allocator local_eee;
  allocator local_eed;
  undefined1 local_eec;
  undefined1 local_eeb;
  undefined1 local_eea;
  undefined1 local_ee9;
  undefined1 local_ee8;
  allocator local_ee7;
  allocator local_ee6;
  allocator local_ee5;
  allocator local_ee4;
  allocator local_ee3;
  allocator local_ee2;
  undefined1 local_ee1;
  undefined1 local_ee0;
  undefined1 local_edf;
  undefined1 local_ede;
  undefined1 local_edd;
  allocator local_edc;
  allocator local_edb;
  allocator local_eda;
  allocator local_ed9;
  allocator local_ed8;
  allocator local_ed7;
  undefined1 local_ed6;
  undefined1 local_ed5;
  undefined1 local_ed4;
  undefined1 local_ed3;
  undefined1 local_ed2;
  allocator local_ed1;
  allocator local_ed0;
  allocator local_ecf;
  allocator local_ece;
  allocator local_ecd [20];
  allocator local_eb9;
  string *local_eb8;
  string local_eb0 [32];
  undefined4 local_e90;
  undefined4 local_e8c;
  string local_e88 [32];
  undefined4 local_e68;
  string local_e60 [32];
  undefined4 local_e40;
  string local_e38 [32];
  undefined4 local_e18;
  string local_e10 [32];
  string local_df0 [32];
  undefined4 local_dd0;
  string local_dc8 [32];
  undefined4 local_da8;
  undefined4 local_da4;
  string asStack_da0 [32];
  undefined4 local_d80;
  string asStack_d78 [32];
  undefined4 local_d58;
  string asStack_d50 [32];
  undefined4 local_d30;
  string asStack_d28 [32];
  string asStack_d08 [32];
  undefined4 local_ce8;
  string local_ce0 [32];
  undefined4 local_cc0;
  undefined4 local_cbc;
  string asStack_cb8 [32];
  undefined4 local_c98;
  string asStack_c90 [32];
  undefined4 local_c70;
  string asStack_c68 [32];
  undefined4 local_c48;
  string asStack_c40 [32];
  string asStack_c20 [32];
  undefined4 local_c00;
  string local_bf8 [32];
  undefined4 local_bd8;
  undefined4 local_bd4;
  string asStack_bd0 [32];
  undefined4 local_bb0;
  string asStack_ba8 [32];
  undefined4 local_b88;
  string asStack_b80 [32];
  undefined4 local_b60;
  string asStack_b58 [32];
  string asStack_b38 [32];
  undefined4 local_b18;
  string local_b10 [32];
  undefined4 local_af0;
  undefined4 local_aec;
  string asStack_ae8 [32];
  undefined4 local_ac8;
  string asStack_ac0 [32];
  undefined4 local_aa0;
  string asStack_a98 [32];
  undefined4 local_a78;
  string asStack_a70 [32];
  string asStack_a50 [32];
  undefined4 local_a30;
  string local_a28 [32];
  undefined4 local_a08;
  undefined4 local_a04;
  string asStack_a00 [32];
  undefined4 local_9e0;
  string asStack_9d8 [32];
  undefined4 local_9b8;
  string asStack_9b0 [32];
  undefined4 local_990;
  string asStack_988 [32];
  string asStack_968 [32];
  undefined4 local_948;
  string local_940 [32];
  undefined4 local_920;
  undefined4 local_91c;
  string asStack_918 [32];
  undefined4 local_8f8;
  string asStack_8f0 [32];
  undefined4 local_8d0;
  string asStack_8c8 [32];
  undefined4 local_8a8;
  string asStack_8a0 [32];
  string asStack_880 [32];
  undefined4 local_860;
  string local_858 [32];
  undefined4 local_838;
  undefined4 local_834;
  string asStack_830 [32];
  undefined4 local_810;
  string asStack_808 [32];
  undefined4 local_7e8;
  string asStack_7e0 [32];
  undefined4 local_7c0;
  string asStack_7b8 [32];
  string asStack_798 [32];
  undefined4 local_778;
  string local_770 [32];
  undefined4 local_750;
  undefined4 local_74c;
  string asStack_748 [32];
  undefined4 local_728;
  string asStack_720 [32];
  undefined4 local_700;
  string asStack_6f8 [32];
  undefined4 local_6d8;
  string asStack_6d0 [32];
  string asStack_6b0 [32];
  undefined4 local_690;
  string local_688 [32];
  undefined4 local_668;
  undefined4 local_664;
  string asStack_660 [32];
  undefined4 local_640;
  string asStack_638 [32];
  undefined4 local_618;
  string asStack_610 [32];
  undefined4 local_5f0;
  string asStack_5e8 [32];
  string asStack_5c8 [32];
  undefined4 local_5a8;
  string local_5a0 [32];
  undefined4 local_580;
  undefined4 local_57c;
  string asStack_578 [32];
  undefined4 local_558;
  string asStack_550 [32];
  undefined4 local_530;
  string asStack_528 [32];
  undefined4 local_508;
  string asStack_500 [32];
  string asStack_4e0 [32];
  undefined4 local_4c0;
  string local_4b8 [32];
  undefined4 local_498;
  undefined4 local_494;
  string asStack_490 [32];
  undefined4 local_470;
  string asStack_468 [32];
  undefined4 local_448;
  string asStack_440 [32];
  undefined4 local_420;
  string asStack_418 [32];
  string asStack_3f8 [32];
  undefined4 local_3d8;
  string local_3d0 [32];
  undefined4 local_3b0;
  undefined4 local_3ac;
  string asStack_3a8 [32];
  undefined4 local_388;
  string asStack_380 [32];
  undefined4 local_360;
  string asStack_358 [32];
  undefined4 local_338;
  string asStack_330 [32];
  string asStack_310 [32];
  undefined4 local_2f0;
  string local_2e8 [32];
  undefined4 local_2c8;
  undefined4 local_2c4;
  string asStack_2c0 [32];
  undefined4 local_2a0;
  string asStack_298 [32];
  undefined4 local_278;
  string asStack_270 [32];
  undefined4 local_250;
  string asStack_248 [32];
  string asStack_228 [32];
  undefined4 local_208;
  string local_200 [32];
  undefined4 local_1e0;
  undefined4 local_1dc;
  string asStack_1d8 [32];
  undefined4 local_1b8;
  string asStack_1b0 [32];
  undefined4 local_190;
  string asStack_188 [32];
  undefined4 local_168;
  string asStack_160 [32];
  string asStack_140 [32];
  undefined4 local_120;
  string local_118 [32];
  undefined4 local_f8;
  undefined4 local_f4;
  string asStack_f0 [32];
  undefined4 local_d0;
  string asStack_c8 [32];
  undefined4 local_a8;
  string asStack_a0 [32];
  undefined4 local_80;
  string asStack_78 [32];
  string asStack_58 [32];
  undefined4 local_38;
  string *local_30;
  undefined8 local_28;
  undefined1 local_20 [32];
  
  local_f7c = 1;
  local_eb8 = local_eb0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_eb0,
             "pk(02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397)#rk5v7uqw",
             &local_eb9);
  local_ed6 = 1;
  local_e90 = 0;
  local_e8c = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e88,"2102a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397ac",
             local_ecd);
  local_ed5 = 1;
  local_e68 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e60,"1FoG2386FG2tAJS9acMuiDsKy67aGg9MKz",&local_ece);
  local_ed4 = 1;
  local_e40 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e38,"",&local_ecf);
  local_ed3 = 1;
  local_e18 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e10,"02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397",
             &local_ed0);
  local_ed2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df0,"",&local_ed1);
  local_dd0 = 0;
  local_ed2 = 0;
  local_ed3 = 0;
  local_ed4 = 0;
  local_ed5 = 0;
  local_ed6 = 0;
  local_eb8 = local_dc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_dc8,"pkh(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)",
             &local_ed7);
  local_ee1 = 1;
  local_da8 = 0;
  local_da4 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_da0,"76a91406afd46bcdfd22ef94ac122aa11f241244a37ecc88ac",&local_ed8);
  local_ee0 = 1;
  local_d80 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_d78,"1cMh228HTCiwS8ZsaakH8A8wze1JR5ZsP",&local_ed9);
  local_edf = 1;
  local_d58 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_d50,"",&local_eda);
  local_ede = 1;
  local_d30 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_d28,"02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5",
             &local_edb);
  local_edd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_d08,"",&local_edc);
  local_ce8 = 0;
  local_edd = 0;
  local_ede = 0;
  local_edf = 0;
  local_ee0 = 0;
  local_ee1 = 0;
  local_eb8 = local_ce0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ce0,"wpkh(02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9)",
             &local_ee2);
  local_eec = 1;
  local_cc0 = 0;
  local_cbc = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_cb8,"00147dd65592d0ab2fe0d0257d571abf032cd9db93dc",&local_ee3);
  local_eeb = 1;
  local_c98 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c90,"bc1q0ht9tyks4vh7p5p904t340cr9nvahy7u3re7zg",&local_ee4);
  local_eea = 1;
  local_c70 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c68,"",&local_ee5);
  local_ee9 = 1;
  local_c48 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_c40,"02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9",
             &local_ee6);
  local_ee8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c20,"",&local_ee7);
  local_c00 = 0;
  local_ee8 = 0;
  local_ee9 = 0;
  local_eea = 0;
  local_eeb = 0;
  local_eec = 0;
  local_eb8 = local_bf8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_bf8,
             "sh(wpkh(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))",
             &local_eed);
  local_ef7 = 1;
  local_bd8 = 0;
  local_bd4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_bd0,"a914cc6ffbc0bf31af759451068f90ba7a0272b6b33287",&local_eee);
  local_ef6 = 1;
  local_bb0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_ba8,"3LKyvRN6SmYXGBNn8fcQvYxW9MGKtwcinN",&local_eef);
  local_ef5 = 1;
  local_b88 = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_b80,"",&local_ef0);
  local_ef4 = 1;
  local_b60 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_b58,"03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556",
             &local_ef1);
  local_ef3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_b38,"",&local_ef2);
  local_b18 = 0;
  local_ef3 = 0;
  local_ef4 = 0;
  local_ef5 = 0;
  local_ef6 = 0;
  local_ef7 = 0;
  local_eb8 = local_b10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b10,"combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)",
             &local_ef8);
  local_f02 = 1;
  local_af0 = 0;
  local_aec = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_ae8,"0014751e76e8199196d454941c45d1b3a323f1433bd6",&local_ef9);
  local_f01 = 1;
  local_ac8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_ac0,"bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",&local_efa);
  local_f00 = 1;
  local_aa0 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_a98,"",&local_efb);
  local_eff = 1;
  local_a78 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_a70,"0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798",
             &local_efc);
  local_efe = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_a50,"",&local_efd);
  local_a30 = 0;
  local_efe = 0;
  local_eff = 0;
  local_f00 = 0;
  local_f01 = 0;
  local_f02 = 0;
  local_eb8 = local_a28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a28,
             "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
             &local_f03);
  local_f0d = 1;
  local_a08 = 0;
  local_a04 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_a00,"a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",&local_f04);
  local_f0c = 1;
  local_9e0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_9d8,"39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",&local_f05);
  local_f0b = 1;
  local_9b8 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_9b0,"76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",&local_f06);
  local_f0a = 1;
  local_990 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_988,"02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
             &local_f07);
  local_f09 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_968,"",&local_f08);
  local_948 = 0;
  local_f09 = 0;
  local_f0a = 0;
  local_f0b = 0;
  local_f0c = 0;
  local_f0d = 0;
  local_eb8 = local_940;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_940,
             "sh(multi(2,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))"
             ,&local_f0e);
  local_f18 = 1;
  local_920 = 0;
  local_91c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_918,"a914a6a8b030a38762f4c1f5cbe387b61a3c5da5cd2687",&local_f0f);
  local_f17 = 1;
  local_8f8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_8f0,"3GtEB3yg3r5de2cDJG48SkQwxfxJumKQdN",&local_f10);
  local_f16 = 1;
  local_8d0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_8c8,
             "5221022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a012103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe52ae"
             ,&local_f11);
  local_f15 = 1;
  local_8a8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_8a0,"",&local_f12);
  local_f14 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_880,"",&local_f13);
  local_860 = 2;
  local_f14 = 0;
  local_f15 = 0;
  local_f16 = 0;
  local_f17 = 0;
  local_f18 = 0;
  local_eb8 = local_858;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_858,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,&local_f19);
  local_f23 = 1;
  local_838 = 0;
  local_834 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_830,"0020773d709598b76c4e3b575c08aad40658963f9322affc0f8c28d1d9a68d0c944a",
             &local_f1a);
  local_f22 = 1;
  local_810 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_808,"bc1qwu7hp9vckakyuw6htsy244qxtztrlyez4l7qlrpg68v6drgvj39qn4zazc",&local_f1b
            );
  local_f21 = 1;
  local_7e8 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_7e0,
             "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c72103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae"
             ,&local_f1c);
  local_f20 = 1;
  local_7c0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_7b8,"",&local_f1d);
  local_f1f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_798,"",&local_f1e);
  local_778 = 2;
  local_f1f = 0;
  local_f20 = 0;
  local_f21 = 0;
  local_f22 = 0;
  local_f23 = 0;
  local_eb8 = local_770;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_770,
             "sh(wsh(multi(1,03f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8,03499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))"
             ,&local_f24);
  local_f2e = 1;
  local_750 = 0;
  local_74c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_748,"a914aec509e284f909f769bb7dda299a717c87cc97ac87",&local_f25);
  local_f2d = 1;
  local_728 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_720,"3Hd7YQStg9gYpEt6hgK14ZHUABxSURzeuQ",&local_f26);
  local_f2c = 1;
  local_700 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_6f8,
             "512103f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa82103499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e42102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e53ae"
             ,&local_f27);
  local_f2b = 1;
  local_6d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_6d0,"",&local_f28);
  local_f2a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_6b0,"",&local_f29);
  local_690 = 1;
  local_f2a = 0;
  local_f2b = 0;
  local_f2c = 0;
  local_f2d = 0;
  local_f2e = 0;
  local_eb8 = local_688;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_688,
             "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
             &local_f2f);
  local_f39 = 1;
  local_668 = 0;
  local_664 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_660,"a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",&local_f30);
  local_f38 = 1;
  local_640 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_638,"39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",&local_f31);
  local_f37 = 1;
  local_618 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_610,"76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",&local_f32);
  local_f36 = 1;
  local_5f0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_5e8,"02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
             &local_f33);
  local_f35 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_5c8,"",&local_f34);
  local_5a8 = 0;
  local_f35 = 0;
  local_f36 = 0;
  local_f37 = 0;
  local_f38 = 0;
  local_f39 = 0;
  local_eb8 = local_5a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5a0,"addr(bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9)",
             &local_f3a);
  local_f44 = 1;
  local_580 = 0;
  local_57c = 9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_578,"0020c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d",
             &local_f3b);
  local_f43 = 1;
  local_558 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_550,"bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9",&local_f3c
            );
  local_f42 = 1;
  local_530 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_528,"",&local_f3d);
  local_f41 = 1;
  local_508 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_500,"",&local_f3e);
  local_f40 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_4e0,"",&local_f3f);
  local_4c0 = 0;
  local_f40 = 0;
  local_f41 = 0;
  local_f42 = 0;
  local_f43 = 0;
  local_f44 = 0;
  local_eb8 = local_4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4b8,
             "raw(6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e)#zf2avljj"
             ,&local_f45);
  local_f4f = 1;
  local_498 = 0;
  local_494 = 10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_490,
             "6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e"
             ,&local_f46);
  local_f4e = 1;
  local_470 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_468,"",&local_f47);
  local_f4d = 1;
  local_448 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_440,"",&local_f48);
  local_f4c = 1;
  local_420 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_418,"",&local_f49);
  local_f4b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_3f8,"",&local_f4a);
  local_3d8 = 0;
  local_f4b = 0;
  local_f4c = 0;
  local_f4d = 0;
  local_f4e = 0;
  local_f4f = 0;
  local_eb8 = local_3d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3d0,
             "sh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))"
             ,&local_f50);
  local_f5a = 1;
  local_3b0 = 0;
  local_3ac = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_3a8,"a9148019628fc9b183af5d52ed7dc5c6d56fe6a6325f87",&local_f51);
  local_f59 = 1;
  local_388 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_380,"3DNLpswxUiEVyRnAA6mZSvAt7iG6bCu33f",&local_f52);
  local_f58 = 1;
  local_360 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_358,
             "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac"
             ,&local_f53);
  local_f57 = 1;
  local_338 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_330,"",&local_f54);
  local_f56 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_310,"",&local_f55);
  local_2f0 = 0;
  local_f56 = 0;
  local_f57 = 0;
  local_f58 = 0;
  local_f59 = 0;
  local_f5a = 0;
  local_eb8 = local_2e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2e8,"tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)",
             &local_f5b);
  local_f65 = 1;
  local_2c8 = 2;
  local_2c4 = 0xc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_2c0,"5120630f2d9ea4cbcc3f04b73fd56a1c7b51fd3192de8e26e7cd893124900033d3d1",
             &local_f5c);
  local_f64 = 1;
  local_2a0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_298,"bcrt1pvv8jm84ye0xr7p9h8l2k58rm287nryk73cnw0nvfxyjfqqpn60gssz7u5f",
             &local_f5d);
  local_f63 = 1;
  local_278 = 7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_270,"",&local_f5e);
  local_f62 = 1;
  local_250 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_248,"ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",
             &local_f5f);
  local_f61 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_228,"",&local_f60);
  local_208 = 0;
  local_f61 = 0;
  local_f62 = 0;
  local_f63 = 0;
  local_f64 = 0;
  local_f65 = 0;
  local_eb8 = local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_200,
             "tr([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/1)"
             ,&local_f66);
  local_f70 = 1;
  local_1e0 = 0;
  local_1dc = 0xc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_1d8,"5120acb99cf4bb397c8aef2fca4f9201053526f5484174fef211ac6ac7fad0a38a48",
             &local_f67);
  local_f6f = 1;
  local_1b8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_1b0,"bc1p4jueea9m897g4me0ef8eyqg9x5n02jzpwnl0yydvdtrl459r3fyqg8wvnj",&local_f68
            );
  local_f6e = 1;
  local_190 = 7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_188,"",&local_f69);
  local_f6d = 1;
  local_168 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_160,
             "xpub6EKMC2gSMfKgSwn7V9VZn7x1MvoeeVzSmmtSJ4z2L2d6R4WxvdQMouokypZHVp4fgKycrrQnGr6WJ5ED5jG9Q9FiA1q5gKYUc8u6JHJhdo8"
             ,&local_f6a);
  local_f6c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_140,"",&local_f6b);
  local_120 = 0;
  local_f6c = 0;
  local_f6d = 0;
  local_f6e = 0;
  local_f6f = 0;
  local_f70 = 0;
  local_eb8 = local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_118,
             "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a,{c:pk_k(8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816),{c:pk_k([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/1),thresh(2,c:pk_k(5cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc),s:sha256(e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f),a:hash160(dd69735817e0e3f6f826a9238dc2e291184f0131))}})"
             ,&local_f71);
  local_f7b = 1;
  local_f8 = 2;
  local_f4 = 0xc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_f0,"51204f009acbd8c905be4470df1b92c70be16a71d354ba55cc0e6517853f77d79651",
             &local_f72);
  local_f7a = 1;
  local_d0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_c8,"bcrt1pfuqf4j7ceyzmu3rsmude93ctu948r565hf2ucrn9z7zn7a7hjegskj3rsv",
             &local_f73);
  local_f79 = 1;
  local_a8 = 7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_a0,"",&local_f74);
  local_f78 = 1;
  local_80 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_78,"ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",
             &local_f75);
  local_f77 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_58,
             "{tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac),{tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac),tl(205cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bcac7c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87936b82012088a914dd69735817e0e3f6f826a9238dc2e291184f0131876c935287)}}"
             ,&local_f76);
  local_38 = 0;
  local_f77 = 0;
  local_f78 = 0;
  local_f79 = 0;
  local_f7a = 0;
  local_f7b = 0;
  local_f7c = 0;
  local_30 = local_eb0;
  local_28 = 0x10;
  std::allocator<TestCfdAddressFactoryDescriptorData>::allocator
            ((allocator<TestCfdAddressFactoryDescriptorData> *)0x1a1967);
  __l._M_len._0_6_ = in_stack_ffffffffffffdef0;
  __l._M_array = in_stack_ffffffffffffdee8;
  __l._M_len._6_1_ = in_stack_ffffffffffffdef6;
  __l._M_len._7_1_ = in_stack_ffffffffffffdef7;
  std::
  vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
  ::vector((vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
            *)CONCAT17(in_stack_ffffffffffffdee7,in_stack_ffffffffffffdee0),__l,
           in_stack_ffffffffffffded8);
  std::allocator<TestCfdAddressFactoryDescriptorData>::~allocator
            ((allocator<TestCfdAddressFactoryDescriptorData> *)0x1a199b);
  local_2018 = (string *)&local_30;
  do {
    local_2018 = local_2018 + -0xe8;
    TestCfdAddressFactoryDescriptorData::~TestCfdAddressFactoryDescriptorData
              ((TestCfdAddressFactoryDescriptorData *)in_stack_ffffffffffffdeb0);
  } while (local_2018 != local_eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f76);
  std::allocator<char>::~allocator((allocator<char> *)&local_f75);
  std::allocator<char>::~allocator((allocator<char> *)&local_f74);
  std::allocator<char>::~allocator((allocator<char> *)&local_f73);
  std::allocator<char>::~allocator((allocator<char> *)&local_f72);
  std::allocator<char>::~allocator((allocator<char> *)&local_f71);
  std::allocator<char>::~allocator((allocator<char> *)&local_f6b);
  std::allocator<char>::~allocator((allocator<char> *)&local_f6a);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::allocator<char>::~allocator((allocator<char> *)&local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f67);
  std::allocator<char>::~allocator((allocator<char> *)&local_f66);
  std::allocator<char>::~allocator((allocator<char> *)&local_f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_f5f);
  std::allocator<char>::~allocator((allocator<char> *)&local_f5e);
  std::allocator<char>::~allocator((allocator<char> *)&local_f5d);
  std::allocator<char>::~allocator((allocator<char> *)&local_f5c);
  std::allocator<char>::~allocator((allocator<char> *)&local_f5b);
  std::allocator<char>::~allocator((allocator<char> *)&local_f55);
  std::allocator<char>::~allocator((allocator<char> *)&local_f54);
  std::allocator<char>::~allocator((allocator<char> *)&local_f53);
  std::allocator<char>::~allocator((allocator<char> *)&local_f52);
  std::allocator<char>::~allocator((allocator<char> *)&local_f51);
  std::allocator<char>::~allocator((allocator<char> *)&local_f50);
  std::allocator<char>::~allocator((allocator<char> *)&local_f4a);
  std::allocator<char>::~allocator((allocator<char> *)&local_f49);
  std::allocator<char>::~allocator((allocator<char> *)&local_f48);
  std::allocator<char>::~allocator((allocator<char> *)&local_f47);
  std::allocator<char>::~allocator((allocator<char> *)&local_f46);
  std::allocator<char>::~allocator((allocator<char> *)&local_f45);
  std::allocator<char>::~allocator((allocator<char> *)&local_f3f);
  std::allocator<char>::~allocator((allocator<char> *)&local_f3e);
  std::allocator<char>::~allocator((allocator<char> *)&local_f3d);
  std::allocator<char>::~allocator((allocator<char> *)&local_f3c);
  std::allocator<char>::~allocator((allocator<char> *)&local_f3b);
  std::allocator<char>::~allocator((allocator<char> *)&local_f3a);
  std::allocator<char>::~allocator((allocator<char> *)&local_f34);
  std::allocator<char>::~allocator((allocator<char> *)&local_f33);
  std::allocator<char>::~allocator((allocator<char> *)&local_f32);
  std::allocator<char>::~allocator((allocator<char> *)&local_f31);
  std::allocator<char>::~allocator((allocator<char> *)&local_f30);
  std::allocator<char>::~allocator((allocator<char> *)&local_f2f);
  std::allocator<char>::~allocator((allocator<char> *)&local_f29);
  std::allocator<char>::~allocator((allocator<char> *)&local_f28);
  std::allocator<char>::~allocator((allocator<char> *)&local_f27);
  std::allocator<char>::~allocator((allocator<char> *)&local_f26);
  std::allocator<char>::~allocator((allocator<char> *)&local_f25);
  std::allocator<char>::~allocator((allocator<char> *)&local_f24);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1d);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1c);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1b);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_f19);
  std::allocator<char>::~allocator((allocator<char> *)&local_f13);
  std::allocator<char>::~allocator((allocator<char> *)&local_f12);
  std::allocator<char>::~allocator((allocator<char> *)&local_f11);
  std::allocator<char>::~allocator((allocator<char> *)&local_f10);
  std::allocator<char>::~allocator((allocator<char> *)&local_f0f);
  std::allocator<char>::~allocator((allocator<char> *)&local_f0e);
  std::allocator<char>::~allocator((allocator<char> *)&local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f07);
  std::allocator<char>::~allocator((allocator<char> *)&local_f06);
  std::allocator<char>::~allocator((allocator<char> *)&local_f05);
  std::allocator<char>::~allocator((allocator<char> *)&local_f04);
  std::allocator<char>::~allocator((allocator<char> *)&local_f03);
  std::allocator<char>::~allocator((allocator<char> *)&local_efd);
  std::allocator<char>::~allocator((allocator<char> *)&local_efc);
  std::allocator<char>::~allocator((allocator<char> *)&local_efb);
  std::allocator<char>::~allocator((allocator<char> *)&local_efa);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef2);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef1);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef0);
  std::allocator<char>::~allocator((allocator<char> *)&local_eef);
  std::allocator<char>::~allocator((allocator<char> *)&local_eee);
  std::allocator<char>::~allocator((allocator<char> *)&local_eed);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee7);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee6);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee5);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee4);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee3);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee2);
  std::allocator<char>::~allocator((allocator<char> *)&local_edc);
  std::allocator<char>::~allocator((allocator<char> *)&local_edb);
  std::allocator<char>::~allocator((allocator<char> *)&local_eda);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed7);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed1);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ecf);
  std::allocator<char>::~allocator((allocator<char> *)&local_ece);
  std::allocator<char>::~allocator((allocator<char> *)local_ecd);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  cfd::DescriptorScriptData::DescriptorScriptData
            ((DescriptorScriptData *)CONCAT17(in_stack_ffffffffffffdee7,in_stack_ffffffffffffdee0));
  local_12c0[0]._0_8_ = local_20;
  local_12c8._M_current =
       (TestCfdAddressFactoryDescriptorData *)
       std::
       vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
       ::begin((vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
                *)in_stack_ffffffffffffdea8);
  local_12f8._40_8_ =
       std::
       vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
       ::end((vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
              *)in_stack_ffffffffffffdea8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<TestCfdAddressFactoryDescriptorData_*,_std::vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>_>
                             *)in_stack_ffffffffffffdeb0,
                            (__normal_iterator<TestCfdAddressFactoryDescriptorData_*,_std::vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>_>
                             *)in_stack_ffffffffffffdea8), bVar1) {
    __gnu_cxx::
    __normal_iterator<TestCfdAddressFactoryDescriptorData_*,_std::vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>_>
    ::operator*(&local_12c8);
    TestCfdAddressFactoryDescriptorData::TestCfdAddressFactoryDescriptorData
              ((TestCfdAddressFactoryDescriptorData *)
               CONCAT17(in_stack_ffffffffffffdef7,
                        CONCAT16(in_stack_ffffffffffffdef6,in_stack_ffffffffffffdef0)),
               in_stack_ffffffffffffdee8);
    cfd::AddressFactory::AddressFactory(&local_13e0,local_1398);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1738,"",&local_1739);
    in_stack_ffffffffffffdea8 = (DescriptorScriptData *)0x0;
    pcVar4 = (char *)0x0;
    cfd::AddressFactory::ParseOutputDescriptor
              (local_1718,(string *)&local_13e0,local_13b8,(vector *)local_1738,(vector *)0x0);
    cfd::DescriptorScriptData::operator=(in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
    cfd::DescriptorScriptData::~DescriptorScriptData(in_stack_ffffffffffffdeb0);
    std::__cxx11::string::~string(local_1738);
    std::allocator<char>::~allocator((allocator<char> *)&local_1739);
    testing::internal::EqHelper<false>::
    Compare<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
              (in_stack_ffffffffffffdec8,(char *)in_stack_ffffffffffffdec0,
               (DescriptorScriptType *)in_stack_ffffffffffffdeb8,&in_stack_ffffffffffffdeb0->type);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1750);
    if (!bVar1) {
      testing::Message::Message(&local_1758);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1a3915);
      testing::internal::AssertHelper::AssertHelper
                (&local_1760,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x33c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1760,&local_1758);
      testing::internal::AssertHelper::~AssertHelper(&local_1760);
      testing::Message::~Message((Message *)0x1a3978);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a39d0);
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffdec8,(char *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffdeb0);
    std::__cxx11::string::~string(local_1790);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1770);
    if (!bVar1) {
      testing::Message::Message(&local_1798);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1a3ac6);
      testing::internal::AssertHelper::AssertHelper
                (&local_17a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x33d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_17a0,&local_1798);
      testing::internal::AssertHelper::~AssertHelper(&local_17a0);
      testing::Message::~Message((Message *)0x1a3b29);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a3b7e);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              (in_stack_ffffffffffffdec8,(char *)in_stack_ffffffffffffdec0,
               (uint *)in_stack_ffffffffffffdeb8,&in_stack_ffffffffffffdeb0->type);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_17b0);
    if (!bVar1) {
      testing::Message::Message(&local_17b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1a3c1a);
      testing::internal::AssertHelper::AssertHelper
                (&local_17c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x33e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_17c0,&local_17b8);
      testing::internal::AssertHelper::~AssertHelper(&local_17c0);
      testing::Message::~Message((Message *)0x1a3c7d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a3cd5);
    cfd::core::Address::GetAddress_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffdec8,(char *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffdeb0);
    std::__cxx11::string::~string(local_17f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_17d0);
    if (!bVar1) {
      testing::Message::Message(&local_17f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1a3dcb);
      testing::internal::AssertHelper::AssertHelper
                (&local_1800,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x33f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1800,&local_17f8);
      testing::internal::AssertHelper::~AssertHelper(&local_1800);
      testing::Message::~Message((Message *)0x1a3e2e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a3e83);
    testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
              (in_stack_ffffffffffffdec8,(char *)in_stack_ffffffffffffdec0,
               (AddressType *)in_stack_ffffffffffffdeb8,&in_stack_ffffffffffffdeb0->type);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1810);
    if (!bVar1) {
      testing::Message::Message(&local_1818);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1a3f1f);
      testing::internal::AssertHelper::AssertHelper
                (&local_1820,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x340,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1820,&local_1818);
      testing::internal::AssertHelper::~AssertHelper(&local_1820);
      testing::Message::~Message((Message *)0x1a3f82);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a3fda);
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffdec8,(char *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffdeb0);
    std::__cxx11::string::~string(local_1850);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1830);
    if (!bVar1) {
      testing::Message::Message(&local_1858);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1a40d0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1860,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x341,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1860,&local_1858);
      testing::internal::AssertHelper::~AssertHelper(&local_1860);
      testing::Message::~Message((Message *)0x1a4133);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a4188);
    testing::internal::EqHelper<false>::
    Compare<cfd::core::DescriptorKeyType,cfd::core::DescriptorKeyType>
              (in_stack_ffffffffffffdec8,(char *)in_stack_ffffffffffffdec0,
               (DescriptorKeyType *)in_stack_ffffffffffffdeb8,&in_stack_ffffffffffffdeb0->type);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1870);
    if (!bVar1) {
      testing::Message::Message(&local_1878);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1a421e);
      testing::internal::AssertHelper::AssertHelper
                (&local_1880,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x342,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1880,&local_1878);
      testing::internal::AssertHelper::~AssertHelper(&local_1880);
      testing::Message::~Message((Message *)0x1a427b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a42d0);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffdec8,(char *)in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffdeb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1890);
    if (!bVar1) {
      testing::Message::Message(&local_1898);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1a4366);
      testing::internal::AssertHelper::AssertHelper
                (&local_18a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x343,pcVar2);
      testing::internal::AssertHelper::operator=(&local_18a0,&local_1898);
      testing::internal::AssertHelper::~AssertHelper(&local_18a0);
      testing::Message::~Message((Message *)0x1a43c3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a4418);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              (in_stack_ffffffffffffdec8,(char *)in_stack_ffffffffffffdec0,
               (uint *)in_stack_ffffffffffffdeb8,&in_stack_ffffffffffffdeb0->type);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18b0);
    if (!bVar1) {
      testing::Message::Message(&local_18b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1a44ae);
      testing::internal::AssertHelper::AssertHelper
                (&local_18c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x344,pcVar2);
      testing::internal::AssertHelper::operator=(&local_18c0,&local_18b8);
      testing::internal::AssertHelper::~AssertHelper(&local_18c0);
      testing::Message::~Message((Message *)0x1a450b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a4563);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      in_stack_ffffffffffffdee8 = (TestCfdAddressFactoryDescriptorData *)local_12f8;
      cfd::core::TapBranch::ToString_abi_cxx11_();
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                (in_stack_ffffffffffffdec8,(char *)in_stack_ffffffffffffdec0,
                 in_stack_ffffffffffffdeb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdeb0);
      std::__cxx11::string::~string(local_1938);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1918);
      if (!bVar1) {
        testing::Message::Message(&local_1940);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1a481a);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1948,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                   ,0x348,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1948,&local_1940);
        testing::internal::AssertHelper::~AssertHelper(&local_1948);
        testing::Message::~Message((Message *)0x1a4877);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a48cc);
    }
    else {
      in_stack_ffffffffffffdef7 = cfd::core::TaprootScriptTree::IsValid();
      local_18d1 = ~in_stack_ffffffffffffdef7 & 1;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)in_stack_ffffffffffffdeb0,(bool *)in_stack_ffffffffffffdea8,
                 (type *)0x1a45bb);
      in_stack_ffffffffffffdef6 = testing::AssertionResult::operator_cast_to_bool(&local_18d0);
      if (!(bool)in_stack_ffffffffffffdef6) {
        testing::Message::Message(&local_18e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1908,(internal *)&local_18d0,(AssertionResult *)"data.tree.IsValid()",
                   "true","false",pcVar4);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_18e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                   ,0x346,pcVar4);
        testing::internal::AssertHelper::operator=(&local_18e8,&local_18e0);
        testing::internal::AssertHelper::~AssertHelper(&local_18e8);
        std::__cxx11::string::~string((string *)&local_1908);
        testing::Message::~Message((Message *)0x1a46b3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1a472b);
    }
    cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1a48ea);
    TestCfdAddressFactoryDescriptorData::~TestCfdAddressFactoryDescriptorData
              ((TestCfdAddressFactoryDescriptorData *)in_stack_ffffffffffffdeb0);
    __gnu_cxx::
    __normal_iterator<TestCfdAddressFactoryDescriptorData_*,_std::vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>_>
    ::operator++(&local_12c8);
  }
  cfd::DescriptorScriptData::~DescriptorScriptData(in_stack_ffffffffffffdeb0);
  std::
  vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
  ::~vector(in_stack_ffffffffffffdec0);
  return;
}

Assistant:

TEST(AddressFactory, ParseOutputDescriptor) {
  std::vector<TestCfdAddressFactoryDescriptorData> g_test_cfd_descriptor_data {
    {
      "pk(02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397)#rk5v7uqw",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptPk,
      "2102a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397ac",
      0,
      "1FoG2386FG2tAJS9acMuiDsKy67aGg9MKz",
      AddressType::kP2shAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397",
      "",
      0
    },
    {
      "pkh(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptPkh,
      "76a91406afd46bcdfd22ef94ac122aa11f241244a37ecc88ac",
      0,
      "1cMh228HTCiwS8ZsaakH8A8wze1JR5ZsP",
      AddressType::kP2pkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5",
      "",
      0
    },
    {
      "wpkh(02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptWpkh,
      "00147dd65592d0ab2fe0d0257d571abf032cd9db93dc",
      0,
      "bc1q0ht9tyks4vh7p5p904t340cr9nvahy7u3re7zg",
      AddressType::kP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9",
      "",
      0
    },
    {
      "sh(wpkh(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914cc6ffbc0bf31af759451068f90ba7a0272b6b33287",
      0,
      "3LKyvRN6SmYXGBNn8fcQvYxW9MGKtwcinN",
      AddressType::kP2shP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556",
      "",
      0
    },
    {
      "combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptCombo,
      "0014751e76e8199196d454941c45d1b3a323f1433bd6",
      0,
      "bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",
      AddressType::kP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798",
      "",
      0
    },
    {
      "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",
      0,
      "39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",
      AddressType::kP2shP2wshAddress,
      "76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
      "",
      0
    },
    {
      "sh(multi(2,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914a6a8b030a38762f4c1f5cbe387b61a3c5da5cd2687",
      0,
      "3GtEB3yg3r5de2cDJG48SkQwxfxJumKQdN",
      AddressType::kP2shAddress,
      "5221022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a012103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe52ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      2
    },
    {
      "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptWsh,
      "0020773d709598b76c4e3b575c08aad40658963f9322affc0f8c28d1d9a68d0c944a",
      0,
      "bc1qwu7hp9vckakyuw6htsy244qxtztrlyez4l7qlrpg68v6drgvj39qn4zazc",
      AddressType::kP2wshAddress,
      "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c72103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      2
    },
    {
      "sh(wsh(multi(1,03f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8,03499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914aec509e284f909f769bb7dda299a717c87cc97ac87",
      0,
      "3Hd7YQStg9gYpEt6hgK14ZHUABxSURzeuQ",
      AddressType::kP2shP2wshAddress,
      "512103f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa82103499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e42102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e53ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      1
    },
    {
      "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",
      0,
      "39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",
      AddressType::kP2shP2wshAddress,
      "76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
      "",
      0
    },
    {
      "addr(bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptAddr,
      "0020c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d",
      0,
      "bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9",
      AddressType::kP2wshAddress,
      "",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      0
    },
    {
      "raw(6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e)#zf2avljj",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptRaw,
      "6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e",
      0,
      "",
      AddressType::kP2shAddress,
      "",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      0
    },
    {
      "sh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a9148019628fc9b183af5d52ed7dc5c6d56fe6a6325f87",
      0,
      "3DNLpswxUiEVyRnAA6mZSvAt7iG6bCu33f",
      AddressType::kP2shAddress,
      "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      0
    },
    {
      "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)",
      NetType::kRegtest,
      DescriptorScriptType::kDescriptorScriptTaproot,
      "5120630f2d9ea4cbcc3f04b73fd56a1c7b51fd3192de8e26e7cd893124900033d3d1",
      0,
      "bcrt1pvv8jm84ye0xr7p9h8l2k58rm287nryk73cnw0nvfxyjfqqpn60gssz7u5f",
      AddressType::kTaprootAddress,
      "",
      DescriptorKeyType::kDescriptorKeySchnorr,
      "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",
      "",
      0
    },
    {
      "tr([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/1)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptTaproot,
      "5120acb99cf4bb397c8aef2fca4f9201053526f5484174fef211ac6ac7fad0a38a48",
      0,
      "bc1p4jueea9m897g4me0ef8eyqg9x5n02jzpwnl0yydvdtrl459r3fyqg8wvnj",
      AddressType::kTaprootAddress,
      "",
      DescriptorKeyType::kDescriptorKeyBip32,
      "xpub6EKMC2gSMfKgSwn7V9VZn7x1MvoeeVzSmmtSJ4z2L2d6R4WxvdQMouokypZHVp4fgKycrrQnGr6WJ5ED5jG9Q9FiA1q5gKYUc8u6JHJhdo8",
      "",
      0
    },
    {
      "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a,{c:pk_k(8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816),{c:pk_k([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/1),thresh(2,c:pk_k(5cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc),s:sha256(e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f),a:hash160(dd69735817e0e3f6f826a9238dc2e291184f0131))}})",
      NetType::kRegtest,
      DescriptorScriptType::kDescriptorScriptTaproot,
      "51204f009acbd8c905be4470df1b92c70be16a71d354ba55cc0e6517853f77d79651",
      0,
      "bcrt1pfuqf4j7ceyzmu3rsmude93ctu948r565hf2ucrn9z7zn7a7hjegskj3rsv",
      AddressType::kTaprootAddress,
      "",
      DescriptorKeyType::kDescriptorKeySchnorr,
      "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",
      "{tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac),{tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac),tl(205cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bcac7c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87936b82012088a914dd69735817e0e3f6f826a9238dc2e291184f0131876c935287)}}",
      0
    }
  };

  DescriptorScriptData data;
  for (auto test_data : g_test_cfd_descriptor_data) {
    try {
      AddressFactory factory(test_data.net_type);
      data = factory.ParseOutputDescriptor(test_data.descriptor);
      EXPECT_EQ(test_data.type, data.type);
      EXPECT_EQ(test_data.locking_script, data.locking_script.GetHex());
      EXPECT_EQ(test_data.depth, data.depth);
      EXPECT_EQ(test_data.address, data.address.GetAddress());
      EXPECT_EQ(test_data.address_type, data.address_type);
      EXPECT_EQ(test_data.redeem_script, data.redeem_script.GetHex());
      EXPECT_EQ(test_data.key_type, data.key_type);
      EXPECT_EQ(test_data.key, data.key);
      EXPECT_EQ(test_data.multisig_req_sig_num, data.multisig_req_sig_num);
      if (test_data.tree_string.empty()) {
        EXPECT_FALSE(data.tree.IsValid());
      } else {
        EXPECT_EQ(test_data.tree_string, data.tree.ToString());
      }
    } catch (const std::exception& e) {
      EXPECT_STREQ("", e.what());
      EXPECT_STREQ("", test_data.descriptor.c_str());
    }
  }
}